

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O1

void pre_process_context(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                        JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr
                        ,JDIMENSION out_row_groups_avail)

{
  jpeg_c_prep_controller *pjVar1;
  int *piVar2;
  int source_row;
  uint uVar3;
  JDIMENSION JVar4;
  jpeg_c_prep_controller *pjVar5;
  JSAMPARRAY input_array;
  int iVar6;
  long lVar7;
  int iVar8;
  int row;
  uint uVar9;
  int iVar10;
  long local_60;
  
  if (*out_row_group_ctr < out_row_groups_avail) {
    pjVar5 = cinfo->prep;
    iVar6 = cinfo->max_v_samp_factor * 3;
    pjVar1 = pjVar5 + 1;
    do {
      uVar3 = *in_row_ctr;
      if (uVar3 < in_rows_avail) {
        JVar4 = *(JDIMENSION *)((long)&pjVar5[6].start_pass + 4);
        uVar9 = *(int *)((long)&pjVar5[6].pre_process_data + 4) - JVar4;
        if (in_rows_avail - uVar3 <= uVar9) {
          uVar9 = in_rows_avail - uVar3;
        }
        (*cinfo->cconvert->color_convert)(cinfo,input_buf + uVar3,(JSAMPIMAGE)pjVar1,JVar4,uVar9);
        if ((*(JDIMENSION *)&pjVar5[6].start_pass == cinfo->image_height) &&
           (0 < cinfo->num_components)) {
          lVar7 = 0;
          do {
            if (0 < cinfo->max_v_samp_factor) {
              iVar10 = 0;
              iVar8 = -1;
              do {
                jcopy_sample_rows((JSAMPARRAY)(&pjVar1->start_pass)[lVar7],0,
                                  (JSAMPARRAY)(&pjVar1->start_pass)[lVar7],iVar8,1,
                                  cinfo->image_width);
                iVar10 = iVar10 + 1;
                iVar8 = iVar8 + -1;
              } while (iVar10 < cinfo->max_v_samp_factor);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < cinfo->num_components);
        }
        *in_row_ctr = *in_row_ctr + uVar9;
        piVar2 = (int *)((long)&pjVar5[6].start_pass + 4);
        *piVar2 = *piVar2 + uVar9;
        *(uint *)&pjVar5[6].start_pass = *(int *)&pjVar5[6].start_pass - uVar9;
      }
      else {
        if (*(int *)&pjVar5[6].start_pass != 0) {
          return;
        }
        if (*(int *)((long)&pjVar5[6].start_pass + 4) <
            *(int *)((long)&pjVar5[6].pre_process_data + 4)) {
          if (0 < cinfo->num_components) {
            local_60 = 0;
            do {
              iVar8 = *(int *)((long)&pjVar5[6].start_pass + 4);
              iVar10 = *(int *)((long)&pjVar5[6].pre_process_data + 4);
              if (iVar8 < iVar10) {
                input_array = (JSAMPARRAY)(&pjVar5[1].start_pass)[local_60];
                JVar4 = cinfo->image_width;
                source_row = iVar8 + -1;
                do {
                  jcopy_sample_rows(input_array,source_row,input_array,iVar8,1,JVar4);
                  iVar8 = iVar8 + 1;
                } while (iVar10 != iVar8);
              }
              local_60 = local_60 + 1;
            } while (local_60 < cinfo->num_components);
          }
          *(undefined4 *)((long)&pjVar5[6].start_pass + 4) =
               *(undefined4 *)((long)&pjVar5[6].pre_process_data + 4);
        }
      }
      if (*(int *)((long)&pjVar5[6].start_pass + 4) ==
          *(int *)((long)&pjVar5[6].pre_process_data + 4)) {
        (*cinfo->downsample->downsample)
                  (cinfo,(JSAMPIMAGE)pjVar1,*(JDIMENSION *)&pjVar5[6].pre_process_data,output_buf,
                   *out_row_group_ctr);
        *out_row_group_ctr = *out_row_group_ctr + 1;
        iVar8 = cinfo->max_v_samp_factor;
        iVar10 = *(int *)&pjVar5[6].pre_process_data + iVar8;
        if (iVar6 <= iVar10) {
          iVar10 = 0;
        }
        *(int *)&pjVar5[6].pre_process_data = iVar10;
        if (iVar6 <= *(int *)((long)&pjVar5[6].start_pass + 4)) {
          *(undefined4 *)((long)&pjVar5[6].start_pass + 4) = 0;
        }
        *(int *)((long)&pjVar5[6].pre_process_data + 4) =
             iVar8 + *(int *)((long)&pjVar5[6].start_pass + 4);
      }
    } while (*out_row_group_ctr < out_row_groups_avail);
  }
  return;
}

Assistant:

METHODDEF(void)
pre_process_context(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                    JDIMENSION *in_row_ctr, JDIMENSION in_rows_avail,
                    JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
                    JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr)cinfo->prep;
  int numrows, ci;
  int buf_height = cinfo->max_v_samp_factor * 3;
  JDIMENSION inrows;

  while (*out_row_group_ctr < out_row_groups_avail) {
    if (*in_row_ctr < in_rows_avail) {
      /* Do color conversion to fill the conversion buffer. */
      inrows = in_rows_avail - *in_row_ctr;
      numrows = prep->next_buf_stop - prep->next_buf_row;
      numrows = (int)MIN((JDIMENSION)numrows, inrows);
      (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
                                         prep->color_buf,
                                         (JDIMENSION)prep->next_buf_row,
                                         numrows);
      /* Pad at top of image, if first time through */
      if (prep->rows_to_go == cinfo->image_height) {
        for (ci = 0; ci < cinfo->num_components; ci++) {
          int row;
          for (row = 1; row <= cinfo->max_v_samp_factor; row++) {
            jcopy_sample_rows(prep->color_buf[ci], 0, prep->color_buf[ci],
                              -row, 1, cinfo->image_width);
          }
        }
      }
      *in_row_ctr += numrows;
      prep->next_buf_row += numrows;
      prep->rows_to_go -= numrows;
    } else {
      /* Return for more data, unless we are at the bottom of the image. */
      if (prep->rows_to_go != 0)
        break;
      /* When at bottom of image, pad to fill the conversion buffer. */
      if (prep->next_buf_row < prep->next_buf_stop) {
        for (ci = 0; ci < cinfo->num_components; ci++) {
          expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
                             prep->next_buf_row, prep->next_buf_stop);
        }
        prep->next_buf_row = prep->next_buf_stop;
      }
    }
    /* If we've gotten enough data, downsample a row group. */
    if (prep->next_buf_row == prep->next_buf_stop) {
      (*cinfo->downsample->downsample) (cinfo, prep->color_buf,
                                        (JDIMENSION)prep->this_row_group,
                                        output_buf, *out_row_group_ctr);
      (*out_row_group_ctr)++;
      /* Advance pointers with wraparound as necessary. */
      prep->this_row_group += cinfo->max_v_samp_factor;
      if (prep->this_row_group >= buf_height)
        prep->this_row_group = 0;
      if (prep->next_buf_row >= buf_height)
        prep->next_buf_row = 0;
      prep->next_buf_stop = prep->next_buf_row + cinfo->max_v_samp_factor;
    }
  }
}